

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O2

void ppu_hblank(gba_ppu_t *ppu)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t uVar3;
  int iVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  undefined4 uVar8;
  int iVar9;
  uint uVar10;
  byte bVar11;
  bool bVar12;
  ushort uVar13;
  uint uVar14;
  undefined8 uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  byte bVar19;
  uint uVar20;
  int x_4;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  byte bVar28;
  ushort uVar29;
  int x_1;
  uint uVar30;
  int x;
  uint uVar31;
  int i_1;
  uint uVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  bg_rotation_scaling_t *in_stack_ffffffffffffff28;
  bg_rotation_scaling_t *in_stack_ffffffffffffff38;
  ushort local_a0;
  _Bool bg_enabled [4];
  byte local_94 [4];
  byte local_90;
  byte local_8f;
  _Bool bg_top [6];
  ushort local_5c;
  undefined1 auVar39 [16];
  undefined1 auVar44 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined1 auVar45 [16];
  undefined1 auVar50 [16];
  undefined1 auVar54 [16];
  undefined1 auVar58 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar60 [16];
  short sVar61;
  short sVar62;
  short sVar63;
  
  if (ppu->y < 0xa1 || ppu->y == 0xe3) {
    dma_start_trigger(HBlank);
  }
  uVar5 = (ppu->DISPSTAT).raw;
  if ((uVar5 & 0x10) != 0) {
    request_interrupt(IRQ_HBLANK);
    uVar5 = (ppu->DISPSTAT).raw;
  }
  (ppu->DISPSTAT).raw = uVar5 | 2;
  if (0x9f < ppu->y) {
    return;
  }
  uVar5 = (ppu->DISPCNT).raw;
  uVar7 = (uint)uVar5;
  if ((char)uVar5 < '\0') {
    return;
  }
  switch(uVar5 & 7) {
  case 0:
    if ((uVar5 >> 0xc & 1) != 0) {
      render_obj(ppu);
      uVar7 = (uint)(ppu->DISPCNT).raw;
    }
    if ((uVar7 >> 8 & 1) != 0) {
      uVar3 = (ppu->BG0HOFS).raw;
      uVar5 = (ppu->BG0VOFS).raw;
      uVar1 = (ppu->WININ).raw;
      uVar2 = (ppu->WINOUT).raw;
      uVar6 = ppu->y;
      for (uVar21 = 0; uVar21 != 0xf0; uVar21 = uVar21 + 1) {
        if ((byte)(ppu->WIN0H).raw < uVar21 || uVar21 < (ppu->WIN0H).raw >> 8) {
          bVar33 = false;
        }
        else {
          bVar33 = uVar6 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar6;
        }
        if ((byte)(ppu->WIN1H).raw < uVar21 || uVar21 < (ppu->WIN1H).raw >> 8) {
          bVar12 = false;
        }
        else {
          bVar12 = uVar6 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar6;
        }
        uVar13 = (ppu->DISPCNT).raw;
        bVar11 = (byte)(uVar13 >> 8);
        uVar29 = uVar1;
        if ((((bVar11 >> 5 & 1 & bVar33) == 0) &&
            (uVar29 = uVar1 >> 8 & 1, (bVar11 >> 6 & 1 & bVar12) == 0)) &&
           ((-1 < (short)uVar13 || (uVar29 = uVar2 >> 8 & 1, ppu->obj_window[uVar21] == false)))) {
          if (((bVar33 != false || bVar12 != false) || (uVar2 & 1) != 0) || (uVar13 & 0x6000) == 0)
          {
LAB_00116160:
            (*(code *)(&DAT_001251a8 +
                      *(int *)(&DAT_001251a8 + (ulong)((ppu->BG0CNT).raw >> 0xe) * 4)))
                      (((uint)uVar5 + (uint)uVar6 & 7) << 3,uVar3,&DAT_001251a8,
                       &DAT_001251a8 +
                       *(int *)(&DAT_001251a8 + (ulong)((ppu->BG0CNT).raw >> 0xe) * 4));
            return;
          }
        }
        else if ((uVar29 & 1) != 0) goto LAB_00116160;
        ppu->bgbuf[0][uVar21].raw = *(ushort *)ppu->pram | 0x8000;
      }
      uVar7 = (uint)(ppu->DISPCNT).raw;
    }
    if ((uVar7 >> 9 & 1) != 0) {
      uVar3 = (ppu->BG1HOFS).raw;
      uVar5 = (ppu->BG1VOFS).raw;
      uVar1 = (ppu->WININ).raw;
      uVar2 = (ppu->WINOUT).raw;
      uVar6 = ppu->y;
      for (uVar21 = 0; uVar21 != 0xf0; uVar21 = uVar21 + 1) {
        if ((byte)(ppu->WIN0H).raw < uVar21 || uVar21 < (ppu->WIN0H).raw >> 8) {
          bVar33 = false;
        }
        else {
          bVar33 = uVar6 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar6;
        }
        if ((byte)(ppu->WIN1H).raw < uVar21 || uVar21 < (ppu->WIN1H).raw >> 8) {
          bVar12 = false;
        }
        else {
          bVar12 = uVar6 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar6;
        }
        uVar13 = (ppu->DISPCNT).raw;
        bVar11 = (byte)(uVar13 >> 8);
        uVar29 = uVar1 & 2;
        if ((((bVar11 >> 5 & 1 & bVar33) == 0) &&
            (uVar29 = uVar1 & 0x200, (bVar11 >> 6 & 1 & bVar12) == 0)) &&
           ((-1 < (short)uVar13 || (uVar29 = uVar2 & 0x200, ppu->obj_window[uVar21] == false)))) {
          if (((bVar33 != false || bVar12 != false) || ((byte)uVar2 >> 1 & 1) != 0) ||
              (uVar13 & 0x6000) == 0) {
LAB_00116fd4:
            (*(code *)(&DAT_001251b8 +
                      *(int *)(&DAT_001251b8 + (ulong)((ppu->BG1CNT).raw >> 0xe) * 4)))
                      (((uint)uVar5 + (uint)uVar6 & 7) << 3,uVar3,&DAT_001251b8,
                       &DAT_001251b8 +
                       *(int *)(&DAT_001251b8 + (ulong)((ppu->BG1CNT).raw >> 0xe) * 4));
            return;
          }
        }
        else if (uVar29 != 0) goto LAB_00116fd4;
        ppu->bgbuf[1][uVar21].raw = *(ushort *)ppu->pram | 0x8000;
      }
      uVar7 = (uint)(ppu->DISPCNT).raw;
    }
    if ((uVar7 >> 10 & 1) != 0) {
      uVar3 = (ppu->BG2HOFS).raw;
      uVar5 = (ppu->BG2VOFS).raw;
      uVar1 = (ppu->WININ).raw;
      uVar2 = (ppu->WINOUT).raw;
      uVar6 = ppu->y;
      for (uVar21 = 0; uVar21 != 0xf0; uVar21 = uVar21 + 1) {
        if ((byte)(ppu->WIN0H).raw < uVar21 || uVar21 < (ppu->WIN0H).raw >> 8) {
          bVar33 = false;
        }
        else {
          bVar33 = uVar6 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar6;
        }
        if ((byte)(ppu->WIN1H).raw < uVar21 || uVar21 < (ppu->WIN1H).raw >> 8) {
          bVar12 = false;
        }
        else {
          bVar12 = uVar6 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar6;
        }
        uVar13 = (ppu->DISPCNT).raw;
        bVar11 = (byte)(uVar13 >> 8);
        uVar29 = uVar1 & 4;
        if ((((bVar11 >> 5 & 1 & bVar33) == 0) &&
            (uVar29 = uVar1 & 0x400, (bVar11 >> 6 & 1 & bVar12) == 0)) &&
           ((-1 < (short)uVar13 || (uVar29 = uVar2 & 0x400, ppu->obj_window[uVar21] == false)))) {
          if (((bVar33 != false || bVar12 != false) || ((byte)uVar2 >> 2 & 1) != 0) ||
              (uVar13 & 0x6000) == 0) {
LAB_00117556:
            (*(code *)(&DAT_001251c8 +
                      *(int *)(&DAT_001251c8 + (ulong)((ppu->BG2CNT).raw >> 0xe) * 4)))
                      (((uint)uVar5 + (uint)uVar6 & 7) << 3,uVar3,&DAT_001251c8,
                       &DAT_001251c8 +
                       *(int *)(&DAT_001251c8 + (ulong)((ppu->BG2CNT).raw >> 0xe) * 4));
            return;
          }
        }
        else if (uVar29 != 0) goto LAB_00117556;
        ppu->bgbuf[2][uVar21].raw = *(ushort *)ppu->pram | 0x8000;
      }
      uVar7 = (uint)(ppu->DISPCNT).raw;
    }
    if ((uVar7 >> 0xb & 1) != 0) {
      uVar3 = (ppu->BG3HOFS).raw;
      uVar5 = (ppu->BG3VOFS).raw;
      uVar1 = (ppu->WININ).raw;
      uVar2 = (ppu->WINOUT).raw;
      uVar6 = ppu->y;
      for (uVar21 = 0; uVar21 != 0xf0; uVar21 = uVar21 + 1) {
        if ((byte)(ppu->WIN0H).raw < uVar21 || uVar21 < (ppu->WIN0H).raw >> 8) {
          bVar33 = false;
        }
        else {
          bVar33 = uVar6 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar6;
        }
        if ((byte)(ppu->WIN1H).raw < uVar21 || uVar21 < (ppu->WIN1H).raw >> 8) {
          bVar12 = false;
        }
        else {
          bVar12 = uVar6 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar6;
        }
        uVar13 = (ppu->DISPCNT).raw;
        bVar11 = (byte)(uVar13 >> 8);
        uVar29 = uVar1 & 8;
        if ((((bVar11 >> 5 & 1 & bVar33) == 0) &&
            (uVar29 = uVar1 & 0x800, (bVar11 >> 6 & 1 & bVar12) == 0)) &&
           ((-1 < (short)uVar13 || (uVar29 = uVar2 & 0x800, ppu->obj_window[uVar21] == false)))) {
          if (((bVar33 != false || bVar12 != false) || ((byte)uVar2 >> 3 & 1) != 0) ||
              (uVar13 & 0x6000) == 0) {
LAB_001187d3:
            (*(code *)(&DAT_001251d8 +
                      *(int *)(&DAT_001251d8 + (ulong)((ppu->BG3CNT).raw >> 0xe) * 4)))
                      (((uint)uVar5 + (uint)uVar6 & 7) << 3,uVar3,&DAT_001251d8,
                       &DAT_001251d8 +
                       *(int *)(&DAT_001251d8 + (ulong)((ppu->BG3CNT).raw >> 0xe) * 4));
            return;
          }
        }
        else if (uVar29 != 0) goto LAB_001187d3;
        ppu->bgbuf[3][uVar21].raw = *(ushort *)ppu->pram | 0x8000;
      }
    }
    uVar21 = 0;
    dbg_line_drawn();
    refresh_background_priorities(ppu);
    uVar7 = (ppu->BLDALPHA).raw & 0x1f;
    uVar22 = (ppu->BLDALPHA).raw >> 8 & 0x1f;
    uVar16 = (ppu->BLDY).raw & 0x1f;
    if (0xf < (ushort)uVar16) {
      uVar16 = 0x10;
    }
    bVar11 = (byte)((ppu->DISPCNT).raw >> 8);
    bg_enabled[0] = (_Bool)(bVar11 & 1);
    bg_enabled[1] = (_Bool)(bVar11 >> 1 & 1);
    bg_enabled[2] = (_Bool)(bVar11 >> 2 & 1);
    bg_enabled[3] = (_Bool)(bVar11 >> 3 & 1);
    bVar11 = (byte)(ppu->BLDCNT).raw;
    bg_top[0] = (_Bool)(bVar11 & 1);
    bg_top[1] = (_Bool)(bVar11 >> 1 & 1);
    bg_top[2] = (_Bool)(bVar11 >> 2 & 1);
    bg_top[3] = (_Bool)(bVar11 >> 3 & 1);
    bg_top[4] = (_Bool)(bVar11 >> 4 & 1);
    bg_top[5] = (_Bool)(bVar11 >> 5 & 1);
    bVar11 = (byte)((ppu->BLDCNT).raw >> 8);
    local_94[0] = bVar11 & 1;
    local_94[1] = bVar11 >> 1 & 1;
    local_94[2] = bVar11 >> 2 & 1;
    local_94[3] = bVar11 >> 3 & 1;
    local_90 = bVar11 >> 4 & 1;
    local_8f = bVar11 >> 5 & 1;
    uVar5 = *(ushort *)ppu->pram;
    uVar1 = ppu->y;
    if (0xf < (ushort)uVar22) {
      uVar22 = 0x10;
    }
    uVar23 = (uint)(byte)(0x10 - (char)uVar16);
    if (0xf < (ushort)uVar7) {
      uVar7 = 0x10;
    }
    for (; uVar21 != 0xf0; uVar21 = uVar21 + 1) {
      if ((byte)(ppu->WIN0H).raw < uVar21 || uVar21 < (ppu->WIN0H).raw >> 8) {
        bVar33 = false;
      }
      else {
        bVar33 = uVar1 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar1;
      }
      if ((byte)(ppu->WIN1H).raw < uVar21 || uVar21 < (ppu->WIN1H).raw >> 8) {
        bVar12 = false;
      }
      else {
        bVar12 = uVar1 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar1;
      }
      uVar2 = (ppu->DISPCNT).raw;
      bVar11 = (byte)(uVar2 >> 8);
      if ((bVar11 >> 5 & 1 & bVar33) == 1) {
        bVar11 = *(byte *)&ppu->WININ;
LAB_001180de:
        uVar6 = (ushort)(bVar11 >> 5);
      }
      else {
        if ((bVar11 >> 6 & 1 & bVar12) == 1) {
          uVar6 = (ppu->WININ).raw;
        }
        else {
          if (((short)uVar2 < 0 & ppu->obj_window[uVar21]) != 1) {
            uVar6 = 1;
            if ((uVar2 & 0x6000) != 0 && (bVar33 == false && bVar12 == false)) {
              bVar11 = *(byte *)&ppu->WINOUT;
              goto LAB_001180de;
            }
            goto LAB_00118124;
          }
          uVar6 = (ppu->WINOUT).raw;
        }
        uVar6 = uVar6 >> 0xd;
      }
LAB_00118124:
      uVar2 = (ppu->BLDCNT).raw;
      uVar13 = uVar2 >> 6 & 3;
      local_5c = uVar2 & 0xc0;
      iVar24 = (black.raw & 0x1f) * uVar16;
      iVar25 = (black.raw >> 5 & 0x1f) * uVar16;
      iVar17 = (black.raw >> 10 & 0x1f) * uVar16;
      iVar26 = (white.raw & 0x1f) * uVar16;
      iVar27 = (white.raw >> 5 & 0x1f) * uVar16;
      iVar18 = (white.raw >> 10 & 0x1f) * uVar16;
      uVar10 = (uint)uVar5;
      iVar9 = 5;
      uVar14 = uVar10;
      for (uVar32 = 3; -1 < (int)uVar32; uVar32 = uVar32 - 1) {
        iVar4 = background_priorities[uVar32];
        bVar11 = local_94[iVar9];
        if ((uVar6 & 1) == 0) {
          bVar19 = 0;
        }
        else {
          bVar19 = (local_5c == 0x40 & bVar11 | (char)uVar2 < '\0') & bg_top[iVar4];
        }
        uVar29 = ppu->bgbuf[iVar4][uVar21].raw;
        bVar28 = -1 < (short)uVar29 & bg_enabled[iVar4];
        uVar31 = (uint)uVar29;
        uVar30 = 0x1f;
        if ((bVar28 == 1) && (bVar19 != 0)) {
          switch(uVar13) {
          case 0:
            goto switchD_001167c9_caseD_0;
          case 1:
            uVar10 = (uVar29 & 0x1f) * uVar7 + (uVar14 & 0x1f) * uVar22 >> 4;
            if (0x1e < (ushort)uVar10) {
              uVar10 = uVar30;
            }
            uVar20 = (uVar29 >> 5 & 0x1f) * uVar7 + (uVar14 >> 5 & 0x1f) * uVar22 >> 4;
            if (0x1e < (ushort)uVar20) {
              uVar20 = uVar30;
            }
            uVar14 = (uVar29 >> 10) * uVar7 + (uVar14 >> 10 & 0x1f) * uVar22 >> 4;
            if (0x1e < (ushort)uVar14) {
              uVar14 = uVar30;
            }
            uVar10 = uVar14 << 10 | uVar20 << 5 | uVar10;
            iVar9 = iVar4;
            goto LAB_001183f2;
          case 2:
            uVar10 = (uVar29 & 0x1f) * uVar23 + iVar26 >> 4;
            if (0x1e < uVar10) {
              uVar10 = uVar30;
            }
            uVar14 = (uVar29 >> 5 & 0x1f) * uVar23 + iVar27 >> 4;
            if (0x1e < uVar14) {
              uVar14 = uVar30;
            }
            uVar31 = (uVar29 >> 10) * uVar23 + iVar18;
            break;
          case 3:
            uVar10 = (uVar29 & 0x1f) * uVar23 + iVar24 >> 4;
            if (0x1e < uVar10) {
              uVar10 = uVar30;
            }
            uVar14 = (uVar29 >> 5 & 0x1f) * uVar23 + iVar25 >> 4;
            if (0x1e < uVar14) {
              uVar14 = uVar30;
            }
            uVar31 = (uVar29 >> 10) * uVar23 + iVar17;
          }
          uVar20 = uVar31 >> 4;
          if (0x1e < uVar31 >> 4) {
            uVar20 = uVar30;
          }
          uVar20 = uVar10 | uVar20 << 10 | uVar14 << 5;
        }
        else {
          uVar20 = uVar31;
          uVar31 = uVar14;
          if (bVar28 == 0) goto LAB_001183f2;
        }
        uVar10 = uVar20;
        uVar31 = (uint)uVar29;
        iVar9 = iVar4;
LAB_001183f2:
        uVar14 = uVar31;
        if (uVar32 == ppu->obj_priorities[uVar21]) {
          uVar29 = ppu->objbuf[uVar21].raw;
          bVar33 = -1 < (short)uVar29;
          uVar20 = (uint)uVar29;
          if (bVar33) {
            uVar10 = uVar20;
          }
          if (bVar33) {
            uVar14 = uVar20;
            iVar9 = 4;
          }
          if ((byte)(bVar33 & ppu->obj_alpha[uVar21] & ((char)uVar2 < '\0' | bVar11)) == 1) {
            if (bVar11 == 0) {
              switch(uVar13) {
              case 0:
                goto switchD_0011699f_caseD_0;
              case 1:
                goto switchD_0011845b_caseD_1;
              case 2:
                uVar10 = (uVar29 & 0x1f) * uVar23 + iVar26 >> 4;
                if (0x1e < uVar10) {
                  uVar10 = 0x1f;
                }
                uVar14 = (uVar29 >> 5 & 0x1f) * uVar23 + iVar27 >> 4;
                if (0x1e < uVar14) {
                  uVar14 = uVar30;
                }
                uVar31 = (uVar29 >> 10) * uVar23 + iVar18;
                break;
              case 3:
                uVar10 = (uVar20 & 0x1f) * uVar23 + iVar24 >> 4;
                if (0x1e < uVar10) {
                  uVar10 = 0x1f;
                }
                uVar14 = (uVar29 >> 5 & 0x1f) * uVar23 + iVar25 >> 4;
                if (0x1e < uVar14) {
                  uVar14 = uVar30;
                }
                uVar31 = (uVar29 >> 10) * uVar23 + iVar17;
              }
              uVar20 = uVar31 >> 4;
              if (0x1e < uVar31 >> 4) {
                uVar20 = uVar30;
              }
              uVar10 = uVar10 | uVar20 << 10 | uVar14 << 5;
              iVar9 = 4;
              uVar14 = (uint)uVar29;
            }
            else {
switchD_0011845b_caseD_1:
              uVar10 = (uVar29 & 0x1f) * uVar7 + (uVar31 & 0x1f) * uVar22 >> 4;
              if (0x1e < (ushort)uVar10) {
                uVar10 = uVar30;
              }
              uVar14 = (uVar29 >> 5 & 0x1f) * uVar7 + (uVar31 >> 5 & 0x1f) * uVar22 >> 4;
              if (0x1e < (ushort)uVar14) {
                uVar14 = uVar30;
              }
              uVar31 = (uVar29 >> 10) * uVar7 + (uVar31 >> 10 & 0x1f) * uVar22 >> 4;
              if (0x1e < (ushort)uVar31) {
                uVar31 = uVar30;
              }
              uVar10 = uVar31 << 10 | uVar14 << 5 | uVar10;
              iVar9 = 4;
              uVar14 = (uint)uVar29;
            }
          }
        }
      }
      ppu->screen[uVar1][uVar21].a = 0xff;
      ppu->screen[uVar1][uVar21].r = ((byte)uVar10 & 7) + (byte)uVar10 * '\b';
      bVar11 = (byte)((uVar10 & 0xffff) >> 5);
      ppu->screen[uVar1][uVar21].g = (bVar11 & 7) + bVar11 * '\b';
      bVar11 = (byte)((uVar10 & 0xffff) >> 10);
      ppu->screen[uVar1][uVar21].b = (bVar11 & 7) + bVar11 * '\b';
    }
    break;
  case 1:
    if ((uVar5 >> 0xc & 1) != 0) {
      render_obj(ppu);
      uVar7 = (uint)(ppu->DISPCNT).raw;
    }
    if ((uVar7 >> 8 & 1) != 0) {
      uVar3 = (ppu->BG0HOFS).raw;
      uVar5 = (ppu->BG0VOFS).raw;
      uVar1 = (ppu->WININ).raw;
      uVar2 = (ppu->WINOUT).raw;
      uVar6 = ppu->y;
      for (uVar21 = 0; uVar21 != 0xf0; uVar21 = uVar21 + 1) {
        if ((byte)(ppu->WIN0H).raw < uVar21 || uVar21 < (ppu->WIN0H).raw >> 8) {
          bVar33 = false;
        }
        else {
          bVar33 = uVar6 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar6;
        }
        if ((byte)(ppu->WIN1H).raw < uVar21 || uVar21 < (ppu->WIN1H).raw >> 8) {
          bVar12 = false;
        }
        else {
          bVar12 = uVar6 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar6;
        }
        uVar13 = (ppu->DISPCNT).raw;
        bVar11 = (byte)(uVar13 >> 8);
        uVar29 = uVar1;
        if ((((bVar11 >> 5 & 1 & bVar33) == 0) &&
            (uVar29 = uVar1 >> 8 & 1, (bVar11 >> 6 & 1 & bVar12) == 0)) &&
           ((-1 < (short)uVar13 || (uVar29 = uVar2 >> 8 & 1, ppu->obj_window[uVar21] == false)))) {
          if (((bVar33 != false || bVar12 != false) || (uVar2 & 1) != 0) || (uVar13 & 0x6000) == 0)
          {
LAB_00116d18:
            (*(code *)(&DAT_00125168 +
                      *(int *)(&DAT_00125168 + (ulong)((ppu->BG0CNT).raw >> 0xe) * 4)))
                      (((uint)uVar5 + (uint)uVar6 & 7) << 3,uVar3,&DAT_00125168,
                       &DAT_00125168 +
                       *(int *)(&DAT_00125168 + (ulong)((ppu->BG0CNT).raw >> 0xe) * 4));
            return;
          }
        }
        else if ((uVar29 & 1) != 0) goto LAB_00116d18;
        ppu->bgbuf[0][uVar21].raw = *(ushort *)ppu->pram | 0x8000;
      }
      uVar7 = (uint)(ppu->DISPCNT).raw;
    }
    if ((uVar7 >> 9 & 1) != 0) {
      uVar3 = (ppu->BG1HOFS).raw;
      uVar5 = (ppu->BG1VOFS).raw;
      uVar1 = (ppu->WININ).raw;
      uVar2 = (ppu->WINOUT).raw;
      uVar6 = ppu->y;
      for (uVar21 = 0; uVar21 != 0xf0; uVar21 = uVar21 + 1) {
        if ((byte)(ppu->WIN0H).raw < uVar21 || uVar21 < (ppu->WIN0H).raw >> 8) {
          bVar33 = false;
        }
        else {
          bVar33 = uVar6 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar6;
        }
        if ((byte)(ppu->WIN1H).raw < uVar21 || uVar21 < (ppu->WIN1H).raw >> 8) {
          bVar12 = false;
        }
        else {
          bVar12 = uVar6 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar6;
        }
        uVar13 = (ppu->DISPCNT).raw;
        bVar11 = (byte)(uVar13 >> 8);
        uVar29 = uVar1 & 2;
        if ((((bVar11 >> 5 & 1 & bVar33) == 0) &&
            (uVar29 = uVar1 & 0x200, (bVar11 >> 6 & 1 & bVar12) == 0)) &&
           ((-1 < (short)uVar13 || (uVar29 = uVar2 & 0x200, ppu->obj_window[uVar21] == false)))) {
          if (((bVar33 != false || bVar12 != false) || ((byte)uVar2 >> 1 & 1) != 0) ||
              (uVar13 & 0x6000) == 0) {
LAB_00117297:
            (*(code *)(&DAT_00125178 +
                      *(int *)(&DAT_00125178 + (ulong)((ppu->BG1CNT).raw >> 0xe) * 4)))
                      (((uint)uVar5 + (uint)uVar6 & 7) << 3,uVar3,&DAT_00125178,
                       &DAT_00125178 +
                       *(int *)(&DAT_00125178 + (ulong)((ppu->BG1CNT).raw >> 0xe) * 4));
            return;
          }
        }
        else if (uVar29 != 0) goto LAB_00117297;
        ppu->bgbuf[1][uVar21].raw = *(ushort *)ppu->pram | 0x8000;
      }
      uVar7 = (uint)(ppu->DISPCNT).raw;
    }
    uVar16 = 0x10;
    if ((uVar7 >> 10 & 1) != 0) {
      uVar23._0_2_ = ppu->WININ;
      uVar23._2_2_ = ppu->WINOUT;
      auVar34 = pshuflw(ZEXT416(uVar23),ZEXT416(uVar23),5);
      auVar48 = ZEXT816(0x4040000040400);
      sVar63 = auVar48._6_2_;
      auVar60._0_12_ = auVar48._0_12_;
      auVar60._12_2_ = sVar63;
      auVar60._14_2_ = sVar63;
      sVar62 = auVar48._4_2_;
      auVar59._12_4_ = auVar60._12_4_;
      auVar59._0_10_ = auVar48._0_10_;
      auVar59._10_2_ = sVar62;
      auVar58._10_6_ = auVar59._10_6_;
      auVar58._8_2_ = sVar62;
      auVar58._0_8_ = 0x4040000040400;
      sVar61 = auVar48._2_2_;
      auVar57._8_8_ = auVar58._8_8_;
      auVar57._6_2_ = sVar61;
      auVar57._4_2_ = sVar61;
      auVar57._0_2_ = auVar48._0_2_;
      auVar57._2_2_ = auVar57._0_2_;
      auVar45._0_12_ = auVar34._0_12_;
      auVar45._12_2_ = auVar34._6_2_;
      auVar45._14_2_ = auVar34._6_2_;
      auVar44._12_4_ = auVar45._12_4_;
      auVar44._0_10_ = auVar34._0_10_;
      auVar44._10_2_ = auVar34._4_2_;
      auVar43._10_6_ = auVar44._10_6_;
      auVar43._0_8_ = auVar34._0_8_;
      auVar43._8_2_ = auVar34._4_2_;
      auVar46._8_8_ = auVar43._8_8_;
      auVar46._6_2_ = auVar34._2_2_;
      auVar46._4_2_ = auVar34._2_2_;
      auVar46._0_2_ = auVar34._0_2_;
      auVar46._2_2_ = auVar46._0_2_;
      auVar46 = auVar46 & auVar57;
      auVar47._0_2_ = -(ushort)(auVar46._0_2_ == auVar57._0_2_);
      auVar47._2_2_ = -(ushort)(auVar46._2_2_ == auVar57._0_2_);
      auVar47._4_2_ = -(ushort)(auVar46._4_2_ == sVar61);
      auVar47._6_2_ = -(ushort)(auVar46._6_2_ == sVar61);
      auVar47._8_2_ = -(ushort)(auVar46._8_2_ == sVar62);
      auVar47._10_2_ = -(ushort)(auVar46._10_2_ == sVar62);
      auVar47._12_2_ = -(ushort)(auVar46._12_2_ == sVar63);
      auVar47._14_2_ = -(ushort)(auVar46._14_2_ == sVar63);
      uVar8 = movmskps(uVar7,auVar47);
      bVar11 = (byte)uVar8;
      render_bg_affine(ppu,ppu->bgbuf + 2,&ppu->BG2CNT,(_Bool)(bVar11 >> 3),
                       (_Bool)((bVar11 & 4) >> 2),(_Bool)((bVar11 & 2) >> 1),(_Bool)(bVar11 & 1),
                       &ppu->BG2X,&ppu->BG2Y,&ppu->BG2PA,in_stack_ffffffffffffff28,&ppu->BG2PC,
                       in_stack_ffffffffffffff38);
    }
    dbg_line_drawn();
    refresh_background_priorities(ppu);
    uVar21 = 0;
    uVar23 = (ppu->BLDALPHA).raw & 0x1f;
    uVar22 = (ppu->BLDALPHA).raw >> 8 & 0x1f;
    uVar7 = (ppu->BLDY).raw & 0x1f;
    if (0xf < (ushort)uVar7) {
      uVar7 = uVar16;
    }
    bVar11 = (byte)((ppu->DISPCNT).raw >> 8);
    bg_enabled[0] = (_Bool)(bVar11 & 1);
    bg_enabled[1] = (_Bool)(bVar11 >> 1 & 1);
    bg_enabled[2] = (_Bool)(bVar11 >> 2 & 1);
    bg_enabled[3] = (_Bool)(bVar11 >> 3 & 1);
    bVar11 = (byte)(ppu->BLDCNT).raw;
    bg_top[0] = (_Bool)(bVar11 & 1);
    bg_top[1] = (_Bool)(bVar11 >> 1 & 1);
    bg_top[2] = (_Bool)(bVar11 >> 2 & 1);
    bg_top[3] = (_Bool)(bVar11 >> 3 & 1);
    bg_top[4] = (_Bool)(bVar11 >> 4 & 1);
    bg_top[5] = (_Bool)(bVar11 >> 5 & 1);
    bVar11 = (byte)((ppu->BLDCNT).raw >> 8);
    local_94[0] = bVar11 & 1;
    local_94[1] = bVar11 >> 1 & 1;
    local_94[2] = bVar11 >> 2 & 1;
    local_94[3] = bVar11 >> 3 & 1;
    local_90 = bVar11 >> 4 & 1;
    local_8f = bVar11 >> 5 & 1;
    uVar5 = *(ushort *)ppu->pram;
    uVar1 = ppu->y;
    if (0xf < (ushort)uVar22) {
      uVar22 = uVar16;
    }
    uVar32 = (uint)(byte)(0x10 - (char)uVar7);
    if (0xf < (ushort)uVar23) {
      uVar23 = uVar16;
    }
    for (; uVar21 != 0xf0; uVar21 = uVar21 + 1) {
      if ((byte)(ppu->WIN0H).raw < uVar21 || uVar21 < (ppu->WIN0H).raw >> 8) {
        bVar33 = false;
      }
      else {
        bVar33 = uVar1 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar1;
      }
      if ((byte)(ppu->WIN1H).raw < uVar21 || uVar21 < (ppu->WIN1H).raw >> 8) {
        bVar12 = false;
      }
      else {
        bVar12 = uVar1 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar1;
      }
      uVar2 = (ppu->DISPCNT).raw;
      bVar11 = (byte)(uVar2 >> 8);
      if ((bVar11 >> 5 & 1 & bVar33) == 1) {
        bVar11 = *(byte *)&ppu->WININ;
LAB_0011794a:
        uVar6 = (ushort)(bVar11 >> 5);
      }
      else {
        if ((bVar11 >> 6 & 1 & bVar12) == 1) {
          uVar6 = (ppu->WININ).raw;
        }
        else {
          if (((short)uVar2 < 0 & ppu->obj_window[uVar21]) != 1) {
            uVar6 = 1;
            if ((uVar2 & 0x6000) != 0 && (bVar33 == false && bVar12 == false)) {
              bVar11 = *(byte *)&ppu->WINOUT;
              goto LAB_0011794a;
            }
            goto LAB_00117990;
          }
          uVar6 = (ppu->WINOUT).raw;
        }
        uVar6 = uVar6 >> 0xd;
      }
LAB_00117990:
      uVar2 = (ppu->BLDCNT).raw;
      uVar13 = uVar2 >> 6 & 3;
      local_5c = uVar2 & 0xc0;
      iVar24 = (black.raw & 0x1f) * uVar7;
      iVar25 = (black.raw >> 5 & 0x1f) * uVar7;
      iVar17 = (black.raw >> 10 & 0x1f) * uVar7;
      iVar26 = (white.raw & 0x1f) * uVar7;
      iVar27 = (white.raw >> 5 & 0x1f) * uVar7;
      iVar18 = (white.raw >> 10 & 0x1f) * uVar7;
      uVar10 = (uint)uVar5;
      iVar9 = 5;
      uVar14 = uVar10;
      for (uVar16 = 3; -1 < (int)uVar16; uVar16 = uVar16 - 1) {
        iVar4 = background_priorities[uVar16];
        bVar11 = local_94[iVar9];
        if ((uVar6 & 1) == 0) {
          bVar19 = 0;
        }
        else {
          bVar19 = (local_5c == 0x40 & bVar11 | (char)uVar2 < '\0') & bg_top[iVar4];
        }
        uVar29 = ppu->bgbuf[iVar4][uVar21].raw;
        bVar28 = -1 < (short)uVar29 & bg_enabled[iVar4];
        uVar31 = (uint)uVar29;
        uVar30 = 0x1f;
        if ((bVar28 == 1) && (bVar19 != 0)) {
          switch(uVar13) {
          case 0:
            goto switchD_001167c9_caseD_0;
          case 1:
            uVar10 = (uVar29 & 0x1f) * uVar23 + (uVar14 & 0x1f) * uVar22 >> 4;
            if (0x1e < (ushort)uVar10) {
              uVar10 = uVar30;
            }
            uVar20 = (uVar29 >> 5 & 0x1f) * uVar23 + (uVar14 >> 5 & 0x1f) * uVar22 >> 4;
            if (0x1e < (ushort)uVar20) {
              uVar20 = uVar30;
            }
            uVar14 = (uVar29 >> 10) * uVar23 + (uVar14 >> 10 & 0x1f) * uVar22 >> 4;
            if (0x1e < (ushort)uVar14) {
              uVar14 = uVar30;
            }
            uVar10 = uVar14 << 10 | uVar20 << 5 | uVar10;
            iVar9 = iVar4;
            goto LAB_00117c62;
          case 2:
            uVar10 = (uVar29 & 0x1f) * uVar32 + iVar26 >> 4;
            if (0x1e < uVar10) {
              uVar10 = uVar30;
            }
            uVar14 = (uVar29 >> 5 & 0x1f) * uVar32 + iVar27 >> 4;
            if (0x1e < uVar14) {
              uVar14 = uVar30;
            }
            uVar31 = (uVar29 >> 10) * uVar32 + iVar18;
            break;
          case 3:
            uVar10 = (uVar29 & 0x1f) * uVar32 + iVar24 >> 4;
            if (0x1e < uVar10) {
              uVar10 = uVar30;
            }
            uVar14 = (uVar29 >> 5 & 0x1f) * uVar32 + iVar25 >> 4;
            if (0x1e < uVar14) {
              uVar14 = uVar30;
            }
            uVar31 = (uVar29 >> 10) * uVar32 + iVar17;
          }
          uVar20 = uVar31 >> 4;
          if (0x1e < uVar31 >> 4) {
            uVar20 = uVar30;
          }
          uVar20 = uVar10 | uVar20 << 10 | uVar14 << 5;
        }
        else {
          uVar20 = uVar31;
          uVar31 = uVar14;
          if (bVar28 == 0) goto LAB_00117c62;
        }
        uVar10 = uVar20;
        uVar31 = (uint)uVar29;
        iVar9 = iVar4;
LAB_00117c62:
        uVar14 = uVar31;
        if (uVar16 == ppu->obj_priorities[uVar21]) {
          uVar29 = ppu->objbuf[uVar21].raw;
          bVar33 = -1 < (short)uVar29;
          uVar20 = (uint)uVar29;
          if (bVar33) {
            uVar10 = uVar20;
          }
          if (bVar33) {
            uVar14 = uVar20;
            iVar9 = 4;
          }
          if ((byte)(bVar33 & ppu->obj_alpha[uVar21] & ((char)uVar2 < '\0' | bVar11)) == 1) {
            if (bVar11 == 0) {
              switch(uVar13) {
              case 0:
                goto switchD_0011699f_caseD_0;
              case 1:
                goto switchD_00117cc9_caseD_1;
              case 2:
                uVar10 = (uVar29 & 0x1f) * uVar32 + iVar26 >> 4;
                if (0x1e < uVar10) {
                  uVar10 = 0x1f;
                }
                uVar14 = (uVar29 >> 5 & 0x1f) * uVar32 + iVar27 >> 4;
                if (0x1e < uVar14) {
                  uVar14 = uVar30;
                }
                uVar31 = (uVar29 >> 10) * uVar32 + iVar18;
                break;
              case 3:
                uVar10 = (uVar20 & 0x1f) * uVar32 + iVar24 >> 4;
                if (0x1e < uVar10) {
                  uVar10 = 0x1f;
                }
                uVar14 = (uVar29 >> 5 & 0x1f) * uVar32 + iVar25 >> 4;
                if (0x1e < uVar14) {
                  uVar14 = uVar30;
                }
                uVar31 = (uVar29 >> 10) * uVar32 + iVar17;
              }
              uVar20 = uVar31 >> 4;
              if (0x1e < uVar31 >> 4) {
                uVar20 = uVar30;
              }
              uVar10 = uVar10 | uVar20 << 10 | uVar14 << 5;
              iVar9 = 4;
              uVar14 = (uint)uVar29;
            }
            else {
switchD_00117cc9_caseD_1:
              uVar10 = (uVar29 & 0x1f) * uVar23 + (uVar31 & 0x1f) * uVar22 >> 4;
              if (0x1e < (ushort)uVar10) {
                uVar10 = uVar30;
              }
              uVar14 = (uVar29 >> 5 & 0x1f) * uVar23 + (uVar31 >> 5 & 0x1f) * uVar22 >> 4;
              if (0x1e < (ushort)uVar14) {
                uVar14 = uVar30;
              }
              uVar31 = (uVar29 >> 10) * uVar23 + (uVar31 >> 10 & 0x1f) * uVar22 >> 4;
              if (0x1e < (ushort)uVar31) {
                uVar31 = uVar30;
              }
              uVar10 = uVar31 << 10 | uVar14 << 5 | uVar10;
              iVar9 = 4;
              uVar14 = (uint)uVar29;
            }
          }
        }
      }
      ppu->screen[uVar1][uVar21].a = 0xff;
      ppu->screen[uVar1][uVar21].r = ((byte)uVar10 & 7) + (byte)uVar10 * '\b';
      bVar11 = (byte)((uVar10 & 0xffff) >> 5);
      ppu->screen[uVar1][uVar21].g = (bVar11 & 7) + bVar11 * '\b';
      bVar11 = (byte)((uVar10 & 0xffff) >> 10);
      ppu->screen[uVar1][uVar21].b = (bVar11 & 7) + bVar11 * '\b';
    }
    break;
  case 2:
    if ((uVar5 >> 0xc & 1) != 0) {
      render_obj(ppu);
      uVar7 = (uint)(ppu->DISPCNT).raw;
    }
    if ((uVar7 >> 10 & 1) != 0) {
      uVar16._0_2_ = ppu->WININ;
      uVar16._2_2_ = ppu->WINOUT;
      auVar34 = pshuflw(ZEXT416(uVar16),ZEXT416(uVar16),5);
      auVar48 = ZEXT816(0x4040000040400);
      sVar63 = auVar48._6_2_;
      auVar52._0_12_ = auVar48._0_12_;
      auVar52._12_2_ = sVar63;
      auVar52._14_2_ = sVar63;
      sVar62 = auVar48._4_2_;
      auVar51._12_4_ = auVar52._12_4_;
      auVar51._0_10_ = auVar48._0_10_;
      auVar51._10_2_ = sVar62;
      auVar50._10_6_ = auVar51._10_6_;
      auVar50._8_2_ = sVar62;
      auVar50._0_8_ = 0x4040000040400;
      sVar61 = auVar48._2_2_;
      auVar49._8_8_ = auVar50._8_8_;
      auVar49._6_2_ = sVar61;
      auVar49._4_2_ = sVar61;
      auVar49._0_2_ = auVar48._0_2_;
      auVar49._2_2_ = auVar49._0_2_;
      auVar36._0_12_ = auVar34._0_12_;
      auVar36._12_2_ = auVar34._6_2_;
      auVar36._14_2_ = auVar34._6_2_;
      auVar35._12_4_ = auVar36._12_4_;
      auVar35._0_10_ = auVar34._0_10_;
      auVar35._10_2_ = auVar34._4_2_;
      auVar48._10_6_ = auVar35._10_6_;
      auVar48._0_8_ = auVar34._0_8_;
      auVar48._8_2_ = auVar34._4_2_;
      auVar37._8_8_ = auVar48._8_8_;
      auVar37._6_2_ = auVar34._2_2_;
      auVar37._4_2_ = auVar34._2_2_;
      auVar37._0_2_ = auVar34._0_2_;
      auVar37._2_2_ = auVar37._0_2_;
      auVar37 = auVar37 & auVar49;
      auVar34._0_2_ = -(ushort)(auVar37._0_2_ == auVar49._0_2_);
      auVar34._2_2_ = -(ushort)(auVar37._2_2_ == auVar49._0_2_);
      auVar34._4_2_ = -(ushort)(auVar37._4_2_ == sVar61);
      auVar34._6_2_ = -(ushort)(auVar37._6_2_ == sVar61);
      auVar34._8_2_ = -(ushort)(auVar37._8_2_ == sVar62);
      auVar34._10_2_ = -(ushort)(auVar37._10_2_ == sVar62);
      auVar34._12_2_ = -(ushort)(auVar37._12_2_ == sVar63);
      auVar34._14_2_ = -(ushort)(auVar37._14_2_ == sVar63);
      uVar8 = movmskps(uVar7,auVar34);
      bVar11 = (byte)uVar8;
      render_bg_affine(ppu,ppu->bgbuf + 2,&ppu->BG2CNT,(_Bool)(bVar11 >> 3),
                       (_Bool)((bVar11 & 4) >> 2),(_Bool)((bVar11 & 2) >> 1),(_Bool)(bVar11 & 1),
                       &ppu->BG2X,&ppu->BG2Y,&ppu->BG2PA,in_stack_ffffffffffffff28,&ppu->BG2PC,
                       in_stack_ffffffffffffff38);
      uVar7 = (uint)(ppu->DISPCNT).raw;
    }
    if ((uVar7 >> 0xb & 1) != 0) {
      uVar22._0_2_ = ppu->WININ;
      uVar22._2_2_ = ppu->WINOUT;
      auVar34 = pshuflw(ZEXT416(uVar22),ZEXT416(uVar22),5);
      auVar48 = ZEXT816(0x8080000080800);
      sVar63 = auVar48._6_2_;
      auVar56._0_12_ = auVar48._0_12_;
      auVar56._12_2_ = sVar63;
      auVar56._14_2_ = sVar63;
      sVar62 = auVar48._4_2_;
      auVar55._12_4_ = auVar56._12_4_;
      auVar55._0_10_ = auVar48._0_10_;
      auVar55._10_2_ = sVar62;
      auVar54._10_6_ = auVar55._10_6_;
      auVar54._8_2_ = sVar62;
      auVar54._0_8_ = 0x8080000080800;
      sVar61 = auVar48._2_2_;
      auVar53._8_8_ = auVar54._8_8_;
      auVar53._6_2_ = sVar61;
      auVar53._4_2_ = sVar61;
      auVar53._0_2_ = auVar48._0_2_;
      auVar53._2_2_ = auVar53._0_2_;
      auVar40._0_12_ = auVar34._0_12_;
      auVar40._12_2_ = auVar34._6_2_;
      auVar40._14_2_ = auVar34._6_2_;
      auVar39._12_4_ = auVar40._12_4_;
      auVar39._0_10_ = auVar34._0_10_;
      auVar39._10_2_ = auVar34._4_2_;
      auVar38._10_6_ = auVar39._10_6_;
      auVar38._0_8_ = auVar34._0_8_;
      auVar38._8_2_ = auVar34._4_2_;
      auVar41._8_8_ = auVar38._8_8_;
      auVar41._6_2_ = auVar34._2_2_;
      auVar41._4_2_ = auVar34._2_2_;
      auVar41._0_2_ = auVar34._0_2_;
      auVar41._2_2_ = auVar41._0_2_;
      auVar41 = auVar41 & auVar53;
      auVar42._0_2_ = -(ushort)(auVar41._0_2_ == auVar53._0_2_);
      auVar42._2_2_ = -(ushort)(auVar41._2_2_ == auVar53._0_2_);
      auVar42._4_2_ = -(ushort)(auVar41._4_2_ == sVar61);
      auVar42._6_2_ = -(ushort)(auVar41._6_2_ == sVar61);
      auVar42._8_2_ = -(ushort)(auVar41._8_2_ == sVar62);
      auVar42._10_2_ = -(ushort)(auVar41._10_2_ == sVar62);
      auVar42._12_2_ = -(ushort)(auVar41._12_2_ == sVar63);
      auVar42._14_2_ = -(ushort)(auVar41._14_2_ == sVar63);
      uVar8 = movmskps(uVar7,auVar42);
      bVar11 = (byte)uVar8;
      render_bg_affine(ppu,ppu->bgbuf + 3,&ppu->BG3CNT,(_Bool)(bVar11 >> 3),
                       (_Bool)((bVar11 & 4) >> 2),(_Bool)((bVar11 & 2) >> 1),(_Bool)(bVar11 & 1),
                       &ppu->BG3X,&ppu->BG3Y,&ppu->BG3PA,in_stack_ffffffffffffff28,&ppu->BG3PC,
                       in_stack_ffffffffffffff38);
    }
    uVar21 = 0;
    dbg_line_drawn();
    refresh_background_priorities(ppu);
    uVar22 = (ppu->BLDALPHA).raw & 0x1f;
    uVar16 = (ppu->BLDALPHA).raw >> 8 & 0x1f;
    uVar7 = (ppu->BLDY).raw & 0x1f;
    if (0xf < (ushort)uVar7) {
      uVar7 = 0x10;
    }
    bVar11 = (byte)((ppu->DISPCNT).raw >> 8);
    bg_enabled[0] = (_Bool)(bVar11 & 1);
    bg_enabled[1] = (_Bool)(bVar11 >> 1 & 1);
    bg_enabled[2] = (_Bool)(bVar11 >> 2 & 1);
    bg_enabled[3] = (_Bool)(bVar11 >> 3 & 1);
    bVar11 = (byte)(ppu->BLDCNT).raw;
    bg_top[0] = (_Bool)(bVar11 & 1);
    bg_top[1] = (_Bool)(bVar11 >> 1 & 1);
    bg_top[2] = (_Bool)(bVar11 >> 2 & 1);
    bg_top[3] = (_Bool)(bVar11 >> 3 & 1);
    bg_top[4] = (_Bool)(bVar11 >> 4 & 1);
    bg_top[5] = (_Bool)(bVar11 >> 5 & 1);
    bVar11 = (byte)((ppu->BLDCNT).raw >> 8);
    local_94[0] = bVar11 & 1;
    local_94[1] = bVar11 >> 1 & 1;
    local_94[2] = bVar11 >> 2 & 1;
    local_94[3] = bVar11 >> 3 & 1;
    local_90 = bVar11 >> 4 & 1;
    local_8f = bVar11 >> 5 & 1;
    uVar5 = *(ushort *)ppu->pram;
    uVar1 = ppu->y;
    if (0xf < (ushort)uVar16) {
      uVar16 = 0x10;
    }
    uVar23 = (uint)(byte)(0x10 - (char)uVar7);
    if (0xf < (ushort)uVar22) {
      uVar22 = 0x10;
    }
    for (; uVar21 != 0xf0; uVar21 = uVar21 + 1) {
      if ((byte)(ppu->WIN0H).raw < uVar21 || uVar21 < (ppu->WIN0H).raw >> 8) {
        bVar33 = false;
      }
      else {
        bVar33 = uVar1 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar1;
      }
      if ((byte)(ppu->WIN1H).raw < uVar21 || uVar21 < (ppu->WIN1H).raw >> 8) {
        bVar12 = false;
      }
      else {
        bVar12 = uVar1 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar1;
      }
      uVar2 = (ppu->DISPCNT).raw;
      bVar11 = (byte)(uVar2 >> 8);
      if ((bVar11 >> 5 & 1 & bVar33) == 1) {
        bVar11 = *(byte *)&ppu->WININ;
LAB_00116625:
        uVar6 = (ushort)(bVar11 >> 5);
      }
      else {
        if ((bVar11 >> 6 & 1 & bVar12) == 1) {
          uVar6 = (ppu->WININ).raw;
        }
        else {
          if (((short)uVar2 < 0 & ppu->obj_window[uVar21]) != 1) {
            uVar6 = 1;
            if ((uVar2 & 0x6000) != 0 && (bVar33 == false && bVar12 == false)) {
              bVar11 = *(byte *)&ppu->WINOUT;
              goto LAB_00116625;
            }
            goto LAB_0011666b;
          }
          uVar6 = (ppu->WINOUT).raw;
        }
        uVar6 = uVar6 >> 0xd;
      }
LAB_0011666b:
      uVar2 = (ppu->BLDCNT).raw;
      local_a0 = uVar2 & 0xc0;
      iVar24 = (black.raw & 0x1f) * uVar7;
      iVar25 = (black.raw >> 5 & 0x1f) * uVar7;
      iVar17 = (black.raw >> 10 & 0x1f) * uVar7;
      iVar26 = (white.raw & 0x1f) * uVar7;
      iVar27 = (white.raw >> 5 & 0x1f) * uVar7;
      iVar18 = (white.raw >> 10 & 0x1f) * uVar7;
      uVar10 = (uint)uVar5;
      iVar9 = 5;
      uVar14 = uVar10;
      for (uVar32 = 3; -1 < (int)uVar32; uVar32 = uVar32 - 1) {
        iVar4 = background_priorities[uVar32];
        bVar11 = local_94[iVar9];
        if ((uVar6 & 1) == 0) {
          bVar19 = 0;
        }
        else {
          bVar19 = (local_a0 == 0x40 & bVar11 | (char)uVar2 < '\0') & bg_top[iVar4];
        }
        uVar13 = ppu->bgbuf[iVar4][uVar21].raw;
        bVar28 = -1 < (short)uVar13 & bg_enabled[iVar4];
        uVar31 = (uint)uVar13;
        uVar30 = 0x1f;
        if ((bVar28 == 1) && (bVar19 != 0)) {
          switch(uVar2 >> 6 & 3) {
          case 0:
            goto switchD_001167c9_caseD_0;
          case 1:
            uVar10 = (uVar13 & 0x1f) * uVar22 + (uVar14 & 0x1f) * uVar16 >> 4;
            if (0x1e < (ushort)uVar10) {
              uVar10 = uVar30;
            }
            uVar20 = (uVar13 >> 5 & 0x1f) * uVar22 + (uVar14 >> 5 & 0x1f) * uVar16 >> 4;
            if (0x1e < (ushort)uVar20) {
              uVar20 = uVar30;
            }
            uVar14 = (uVar13 >> 10) * uVar22 + (uVar14 >> 10 & 0x1f) * uVar16 >> 4;
            if (0x1e < (ushort)uVar14) {
              uVar14 = uVar30;
            }
            uVar10 = uVar14 << 10 | uVar20 << 5 | uVar10;
            iVar9 = iVar4;
            goto LAB_00116938;
          case 2:
            uVar10 = (uVar13 & 0x1f) * uVar23 + iVar26 >> 4;
            if (0x1e < uVar10) {
              uVar10 = uVar30;
            }
            uVar14 = (uVar13 >> 5 & 0x1f) * uVar23 + iVar27 >> 4;
            if (0x1e < uVar14) {
              uVar14 = uVar30;
            }
            uVar31 = (uVar13 >> 10) * uVar23 + iVar18;
            break;
          case 3:
            uVar10 = (uVar13 & 0x1f) * uVar23 + iVar24 >> 4;
            if (0x1e < uVar10) {
              uVar10 = uVar30;
            }
            uVar14 = (uVar13 >> 5 & 0x1f) * uVar23 + iVar25 >> 4;
            if (0x1e < uVar14) {
              uVar14 = uVar30;
            }
            uVar31 = (uVar13 >> 10) * uVar23 + iVar17;
          }
          uVar20 = uVar31 >> 4;
          if (0x1e < uVar31 >> 4) {
            uVar20 = uVar30;
          }
          uVar20 = uVar10 | uVar20 << 10 | uVar14 << 5;
        }
        else {
          uVar20 = uVar31;
          uVar31 = uVar14;
          if (bVar28 == 0) goto LAB_00116938;
        }
        uVar10 = uVar20;
        uVar31 = (uint)uVar13;
        iVar9 = iVar4;
LAB_00116938:
        uVar14 = uVar31;
        if (uVar32 == ppu->obj_priorities[uVar21]) {
          uVar13 = ppu->objbuf[uVar21].raw;
          bVar33 = -1 < (short)uVar13;
          uVar20 = (uint)uVar13;
          if (bVar33) {
            uVar10 = uVar20;
          }
          if (bVar33) {
            uVar14 = uVar20;
            iVar9 = 4;
          }
          if ((byte)(bVar33 & ppu->obj_alpha[uVar21] & ((char)uVar2 < '\0' | bVar11)) == 1) {
            if (bVar11 == 0) {
              switch(uVar2 >> 6 & 3) {
              case 0:
                goto switchD_0011699f_caseD_0;
              case 1:
                goto switchD_0011699f_caseD_1;
              case 2:
                uVar10 = (uVar13 & 0x1f) * uVar23 + iVar26 >> 4;
                if (0x1e < uVar10) {
                  uVar10 = 0x1f;
                }
                uVar14 = (uVar13 >> 5 & 0x1f) * uVar23 + iVar27 >> 4;
                if (0x1e < uVar14) {
                  uVar14 = uVar30;
                }
                uVar31 = (uVar13 >> 10) * uVar23 + iVar18;
                break;
              case 3:
                uVar10 = (uVar20 & 0x1f) * uVar23 + iVar24 >> 4;
                if (0x1e < uVar10) {
                  uVar10 = 0x1f;
                }
                uVar14 = (uVar13 >> 5 & 0x1f) * uVar23 + iVar25 >> 4;
                if (0x1e < uVar14) {
                  uVar14 = uVar30;
                }
                uVar31 = (uVar13 >> 10) * uVar23 + iVar17;
              }
              uVar20 = uVar31 >> 4;
              if (0x1e < uVar31 >> 4) {
                uVar20 = uVar30;
              }
              uVar10 = uVar10 | uVar20 << 10 | uVar14 << 5;
            }
            else {
switchD_0011699f_caseD_1:
              uVar10 = (uVar13 & 0x1f) * uVar22 + (uVar31 & 0x1f) * uVar16 >> 4;
              if (0x1e < (ushort)uVar10) {
                uVar10 = uVar30;
              }
              uVar14 = (uVar13 >> 5 & 0x1f) * uVar22 + (uVar31 >> 5 & 0x1f) * uVar16 >> 4;
              if (0x1e < (ushort)uVar14) {
                uVar14 = uVar30;
              }
              uVar31 = (uVar13 >> 10) * uVar22 + (uVar31 >> 10 & 0x1f) * uVar16 >> 4;
              if (0x1e < (ushort)uVar31) {
                uVar31 = uVar30;
              }
              uVar10 = uVar31 << 10 | uVar14 << 5 | uVar10;
            }
            iVar9 = 4;
            uVar14 = (uint)uVar13;
          }
        }
      }
      ppu->screen[uVar1][uVar21].a = 0xff;
      ppu->screen[uVar1][uVar21].r = ((byte)uVar10 & 7) + (byte)uVar10 * '\b';
      bVar11 = (byte)((uVar10 & 0xffff) >> 5);
      ppu->screen[uVar1][uVar21].g = (bVar11 & 7) + bVar11 * '\b';
      bVar11 = (byte)((uVar10 & 0xffff) >> 10);
      ppu->screen[uVar1][uVar21].b = (bVar11 & 7) + bVar11 * '\b';
    }
    break;
  case 3:
    render_line_mode3(ppu);
    return;
  case 4:
    render_line_mode4(ppu);
    return;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c",
            0x2fe);
    fprintf(_stderr,"Unknown graphics mode: %d\n\x1b[0;m",(ulong)((ppu->DISPCNT).raw & 7));
    goto LAB_00118944;
  }
  return;
switchD_0011699f_caseD_0:
  uVar15 = 0x246;
  goto LAB_00118928;
switchD_001167c9_caseD_0:
  uVar15 = 0x229;
LAB_00118928:
  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c",
          uVar15);
  fwrite("Determined we should blend even though blending was off?\n\x1b[0;m",0x3e,1,_stderr);
LAB_00118944:
  exit(1);
}

Assistant:

void ppu_hblank(gba_ppu_t* ppu) {
    if (!is_vblank(ppu)) {
        dma_start_trigger(HBlank);
    }
    if (ppu->DISPSTAT.hblank_irq_enable) {
        request_interrupt(IRQ_HBLANK);
    }
    ppu->DISPSTAT.hblank = true;
    if (ppu->y < GBA_SCREEN_Y && !ppu->DISPCNT.forced_blank) { // i.e. not VBlank
        render_line(ppu);
    }
}